

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O0

void Saturation::ProvingHelper::runVampireSaturationImpl(Problem *prb,Options *opt)

{
  bool bVar1;
  ostream *this;
  MainLoop *obj;
  Problem *in_RDI;
  MainLoopResult sres;
  ScopedPtr<Kernel::MainLoop> salg;
  Problem *in_stack_ffffffffffffff68;
  Options *in_stack_ffffffffffffff70;
  Options *this_00;
  TermSharing *in_stack_ffffffffffffff80;
  Options *in_stack_ffffffffffffff98;
  Problem *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ScopedPtr<Kernel::MainLoop> in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [40];
  Problem *local_8;
  
  local_8 = in_RDI;
  Kernel::Unit::onPreprocessingEnd();
  bVar1 = Shell::Options::showPreprocessing(in_stack_ffffffffffffff70);
  if (bVar1) {
    this = std::operator<<((ostream *)&std::cout,"[PP] onPreprocessingEnd(), Proving Helper");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Kernel::Problem::units(local_8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffb0._obj,in_stack_ffffffffffffffa8,
               (allocator<char> *)in_stack_ffffffffffffffa0);
    Shell::UIHelper::outputAllPremises
              ((ostream *)in_stack_ffffffffffffff70,(UnitList *)in_stack_ffffffffffffff68,
               (string *)0xacca68);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  this_00 = (Options *)&Lib::env;
  Indexing::TermSharing::setPoly(in_stack_ffffffffffffff80);
  Shell::Options::resolveAwayAutoValues(this_00,in_stack_ffffffffffffff68);
  *(undefined4 *)&(this_00->_lookup)._longMap._entries[0xc]._key.field_2 = 0x18;
  obj = Kernel::MainLoop::createFromOptions(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Lib::ScopedPtr<Kernel::MainLoop>::ScopedPtr
            ((ScopedPtr<Kernel::MainLoop> *)&stack0xffffffffffffffb0,obj);
  Lib::ScopedPtr<Kernel::MainLoop>::operator->
            ((ScopedPtr<Kernel::MainLoop> *)&stack0xffffffffffffffb0);
  Kernel::MainLoop::run(in_stack_ffffffffffffffb0._obj);
  *(undefined4 *)(DAT_01333840 + 600) = 0x1c;
  Lib::Timer::disableLimitEnforcement();
  Kernel::MainLoopResult::updateStatistics((MainLoopResult *)this_00);
  Lib::ScopedPtr<Kernel::MainLoop>::~ScopedPtr((ScopedPtr<Kernel::MainLoop> *)this_00);
  return;
}

Assistant:

void ProvingHelper::runVampireSaturationImpl(Problem& prb, const Options& opt)
{
  Unit::onPreprocessingEnd();
  if (env.options->showPreprocessing()) {
    std::cout << "[PP] onPreprocessingEnd(), Proving Helper" << std::endl;
    UIHelper::outputAllPremises(std::cout, prb.units(), "New: ");
  }

  //decide whether to use poly or mono well-typedness test
  //after options have been read. Equality Proxy can introduce poly in mono.
  env.sharing->setPoly();

  env.options->resolveAwayAutoValues(prb);

  env.statistics->phase=ExecutionPhase::SATURATION;
  ScopedPtr<MainLoop> salg(MainLoop::createFromOptions(prb, opt));

  MainLoopResult sres(salg->run());
  env.statistics->phase=ExecutionPhase::FINALIZATION;
  Timer::disableLimitEnforcement();
  sres.updateStatistics();
}